

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

int glfwInit(void)

{
  int desiredID;
  undefined8 uVar1;
  GLFWbool GVar2;
  
  if (_glfw.initialized == 0) {
    memset(&_glfw,0,0x21e60);
    _glfw.hints.init.hatButtons = _glfwInitHints.hatButtons;
    _glfw.hints.init.angleType = _glfwInitHints.angleType;
    _glfw.hints.init.platformID = _glfwInitHints.platformID;
    _glfw.hints.init._12_4_ = _glfwInitHints._12_4_;
    uVar1 = _glfw.hints.init._8_8_;
    _glfw.hints.init.vulkanLoader = _glfwInitHints.vulkanLoader;
    _glfw.hints.init.ns = _glfwInitHints.ns;
    _glfw.hints.init.x11.xcbVulkanSurface = _glfwInitHints.x11.xcbVulkanSurface;
    _glfw.hints.init._36_4_ = _glfwInitHints._36_4_;
    _glfw.allocator.allocate = _glfwInitAllocator.allocate;
    _glfw.allocator.reallocate = _glfwInitAllocator.reallocate;
    _glfw.allocator.deallocate = _glfwInitAllocator.deallocate;
    _glfw.allocator.user = _glfwInitAllocator.user;
    if (_glfwInitAllocator.allocate == (GLFWallocatefun)0x0) {
      _glfw.allocator.allocate = defaultAllocate;
      _glfw.allocator.reallocate = defaultReallocate;
      _glfw.allocator.deallocate = defaultDeallocate;
    }
    _glfw.hints.init.platformID = _glfwInitHints.platformID;
    desiredID = _glfw.hints.init.platformID;
    _glfw.hints.init._8_8_ = uVar1;
    GVar2 = _glfwSelectPlatform(desiredID,&_glfw.platform);
    if (GVar2 == 0) {
      return 0;
    }
    GVar2 = (*_glfw.platform.init)();
    if ((((GVar2 == 0) || (GVar2 = _glfwPlatformCreateMutex(&_glfw.errorLock), GVar2 == 0)) ||
        (GVar2 = _glfwPlatformCreateTls(&_glfw.errorSlot), GVar2 == 0)) ||
       (GVar2 = _glfwPlatformCreateTls(&_glfw.contextSlot), GVar2 == 0)) {
      terminate();
      return 0;
    }
    _glfwPlatformSetTls(&_glfw.errorSlot,&_glfwMainThreadError);
    _glfwInitGamepadMappings();
    _glfwPlatformInitTimer();
    _glfw.timer.offset = _glfwPlatformGetTimerValue();
    _glfw.initialized = 1;
    glfwDefaultWindowHints();
  }
  return 1;
}

Assistant:

GLFWAPI int glfwInit(void)
{
    if (_glfw.initialized)
        return GLFW_TRUE;

    memset(&_glfw, 0, sizeof(_glfw));
    _glfw.hints.init = _glfwInitHints;

    _glfw.allocator = _glfwInitAllocator;
    if (!_glfw.allocator.allocate)
    {
        _glfw.allocator.allocate   = defaultAllocate;
        _glfw.allocator.reallocate = defaultReallocate;
        _glfw.allocator.deallocate = defaultDeallocate;
    }

    if (!_glfwSelectPlatform(_glfw.hints.init.platformID, &_glfw.platform))
        return GLFW_FALSE;

    if (!_glfw.platform.init())
    {
        terminate();
        return GLFW_FALSE;
    }

    if (!_glfwPlatformCreateMutex(&_glfw.errorLock) ||
        !_glfwPlatformCreateTls(&_glfw.errorSlot) ||
        !_glfwPlatformCreateTls(&_glfw.contextSlot))
    {
        terminate();
        return GLFW_FALSE;
    }

    _glfwPlatformSetTls(&_glfw.errorSlot, &_glfwMainThreadError);

    _glfwInitGamepadMappings();

    _glfwPlatformInitTimer();
    _glfw.timer.offset = _glfwPlatformGetTimerValue();

    _glfw.initialized = GLFW_TRUE;

    glfwDefaultWindowHints();
    return GLFW_TRUE;
}